

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_fprint(FILE *f,MDD mdd)

{
  size_t sVar1;
  size_t v;
  MDD mdd_local;
  FILE *f_local;
  
  lddmc_serialize_reset();
  sVar1 = lddmc_serialize_add(mdd);
  fprintf((FILE *)f,"%zu,",sVar1);
  lddmc_serialize_totext(f);
  return;
}

Assistant:

void
lddmc_fprint(FILE *f, MDD mdd)
{
    lddmc_serialize_reset();
    size_t v = lddmc_serialize_add(mdd);
    fprintf(f, "%zu,", v);
    lddmc_serialize_totext(f);
}